

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall xatlas::internal::segment::Atlas::growCharts(Atlas *this,float threshold)

{
  float fVar1;
  uint uVar2;
  long lVar3;
  Chart *chart;
  bool bVar4;
  int iVar5;
  char *__function;
  uint face;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  
  if (this->m_facesLeft != 0) {
    uVar8 = 0xffffffff;
    uVar7 = 0;
    fVar9 = 3.4028235e+38;
    uVar6 = 0xffffffff;
    do {
      while( true ) {
        uVar2 = (this->m_charts).m_base.size;
        face = (uint)uVar6;
        if (uVar2 <= uVar7) break;
        lVar3 = *(long *)((this->m_charts).m_base.buffer + (ulong)uVar7 * 8);
        iVar5 = *(int *)(lVar3 + 0xa4);
        if (iVar5 != 0) {
          do {
            uVar2 = *(uint *)(*(long *)(lVar3 + 0x98) + 4 + (ulong)(iVar5 - 1) * 8);
            if ((this->m_faceCharts).m_base.size <= uVar2) {
              __function = "T &xatlas::internal::Array<int>::operator[](uint32_t) [T = int]";
              goto LAB_001ae38f;
            }
            if (*(int *)((this->m_faceCharts).m_base.buffer + (ulong)uVar2 * 4) == -1) {
              fVar1 = *(float *)(*(long *)(lVar3 + 0x98) + (ulong)(iVar5 - 1) * 8);
              if (fVar1 < fVar9) {
                uVar8 = (ulong)uVar7;
                uVar6 = (ulong)uVar2;
                fVar9 = fVar1;
              }
              break;
            }
            CostQueue::pop((CostQueue *)(lVar3 + 0x90));
            iVar5 = *(int *)(lVar3 + 0xa4);
          } while (iVar5 != 0);
        }
        uVar7 = uVar7 + 1;
      }
      if (face == 0xffffffff) {
        return;
      }
      if (threshold < fVar9) {
        return;
      }
      if (uVar2 <= (uint)uVar8) {
        __function = 
        "T &xatlas::internal::Array<xatlas::internal::segment::Chart *>::operator[](uint32_t) [T = xatlas::internal::segment::Chart *]"
        ;
LAB_001ae38f:
        __assert_fail("index < m_base.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4ae,__function);
      }
      chart = *(Chart **)((this->m_charts).m_base.buffer + uVar8 * 8);
      CostQueue::pop(&chart->candidates);
      bVar4 = addFaceToChart(this,chart,face);
      if (!bVar4) {
        if ((this->m_facePlanarRegionId).m_base.size <= face) {
          __function = 
          "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]";
          goto LAB_001ae38f;
        }
        ArrayBase::push_back
                  (&(chart->failedPlanarRegions).m_base,
                   (this->m_facePlanarRegionId).m_base.buffer + uVar6 * 4);
      }
      fVar9 = 3.4028235e+38;
      uVar7 = 0;
      uVar8 = 0xffffffff;
      uVar6 = 0xffffffff;
    } while (this->m_facesLeft != 0);
  }
  return;
}

Assistant:

void growCharts(float threshold)
	{
		XA_PROFILE_START(buildAtlasGrowCharts)
		for (;;) {
			if (m_facesLeft == 0)
				break;
			// Get the single best candidate out of the chart best candidates.
			uint32_t bestFace = UINT32_MAX, bestChart = UINT32_MAX;
			float lowestCost = FLT_MAX;
			for (uint32_t i = 0; i < m_charts.size(); i++) {
				Chart *chart = m_charts[i];
				// Get the best candidate from the chart.
				// Cleanup any best candidates that have been claimed by another chart.
				uint32_t face = UINT32_MAX;
				float cost = FLT_MAX;
				for (;;) {
					if (chart->candidates.count() == 0)
						break;
					cost = chart->candidates.peekCost();
					face = chart->candidates.peekFace();
					if (m_faceCharts[face] == -1)
						break;
					else {
						// Face belongs to another chart. Pop from queue so the next best candidate can be retrieved.
						chart->candidates.pop();
						face = UINT32_MAX;
					}
				}
				if (face == UINT32_MAX)
					continue; // No candidates for this chart.
				// See if best candidate overall.
				if (cost < lowestCost) {
					lowestCost = cost;
					bestFace = face;
					bestChart = i;
				}
			}
			if (bestFace == UINT32_MAX || lowestCost > threshold)
				break;
			Chart *chart = m_charts[bestChart];
			chart->candidates.pop(); // Pop the selected candidate from the queue.
			if (!addFaceToChart(chart, bestFace))
				chart->failedPlanarRegions.push_back(m_facePlanarRegionId[bestFace]);
		}
		XA_PROFILE_END(buildAtlasGrowCharts)
	}